

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSpecConstantTests.cpp
# Opt level: O0

void vkt::pipeline::anon_unknown_0::logValueMismatch
               (TestLog *log,void *expected,void *actual,deUint32 offset,deUint32 size)

{
  MessageBuilder *pMVar1;
  string local_2c0;
  byte local_29b;
  allocator<char> local_29a;
  byte local_299;
  deUint64 local_298;
  string local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string local_250;
  byte local_22b;
  allocator<char> local_22a;
  byte local_229;
  deUint64 local_228;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string local_1e0;
  MessageBuilder local_1b0;
  byte local_29;
  deUint32 local_28;
  deUint32 dStack_24;
  bool canDisplayValue;
  deUint32 size_local;
  deUint32 offset_local;
  void *actual_local;
  void *expected_local;
  TestLog *log_local;
  
  local_29 = size < 9;
  local_28 = size;
  dStack_24 = offset;
  _size_local = (_anonymous_namespace_ *)actual;
  actual_local = expected;
  expected_local = log;
  tcu::TestLog::operator<<(&local_1b0,log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<
                     (&local_1b0,(char (*) [39])"Comparison failed for value at offset ");
  de::toString<unsigned_int>(&local_1e0,&stack0xffffffffffffffdc);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_1e0);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [12])0x132e8f0);
  local_229 = 0;
  local_22b = 0;
  if ((local_29 & 1) == 0) {
    std::allocator<char>::allocator();
    local_22b = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"",&local_22a);
  }
  else {
    local_228 = memoryAsInteger(actual_local,local_28);
    de::toString<unsigned_long>(&local_220,&local_228);
    local_229 = 1;
    std::operator+(&local_200,&local_220," ");
  }
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_200);
  pipeline::(anonymous_namespace)::memoryAsHexString_abi_cxx11_
            (&local_250,(_anonymous_namespace_ *)actual_local,(void *)(ulong)local_28,offset);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_250);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [10])0x12d0397);
  local_299 = 0;
  local_29b = 0;
  if ((local_29 & 1) == 0) {
    std::allocator<char>::allocator();
    local_29b = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"",&local_29a);
  }
  else {
    local_298 = memoryAsInteger(_size_local,local_28);
    de::toString<unsigned_long>(&local_290,&local_298);
    local_299 = 1;
    std::operator+(&local_270,&local_290," ");
  }
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_270);
  pipeline::(anonymous_namespace)::memoryAsHexString_abi_cxx11_
            (&local_2c0,_size_local,(void *)(ulong)local_28,offset);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_2c0);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_270);
  if ((local_29b & 1) != 0) {
    std::allocator<char>::~allocator(&local_29a);
  }
  if ((local_299 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_290);
  }
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_200);
  if ((local_22b & 1) != 0) {
    std::allocator<char>::~allocator(&local_22a);
  }
  if ((local_229 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_220);
  }
  std::__cxx11::string::~string((string *)&local_1e0);
  tcu::MessageBuilder::~MessageBuilder(&local_1b0);
  return;
}

Assistant:

void logValueMismatch (tcu::TestLog& log, const void* expected, const void* actual, const deUint32 offset, const deUint32 size)
{
	const bool canDisplayValue = (size <= sizeof(deUint64));
	log << tcu::TestLog::Message
		<< "Comparison failed for value at offset " << de::toString(offset) << ": expected "
		<< (canDisplayValue ? de::toString(memoryAsInteger(expected, size)) + " " : "") << memoryAsHexString(expected, size) << " but got "
		<< (canDisplayValue ? de::toString(memoryAsInteger(actual, size)) + " " : "") << memoryAsHexString(actual, size)
		<< tcu::TestLog::EndMessage;
}